

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomProperty::clear(DomProperty *this)

{
  DomColor *this_00;
  DomPoint *this_01;
  DomRect *this_02;
  DomSize *this_03;
  DomDate *this_04;
  DomTime *this_05;
  DomDateTime *this_06;
  DomPointF *this_07;
  DomRectF *this_08;
  DomChar *this_09;
  long in_RDI;
  DomStringList *in_stack_ffffffffffffff50;
  DomUrl *this_10;
  DomPalette *in_stack_ffffffffffffff60;
  DomBrush *this_11;
  DomResourceIcon *in_stack_ffffffffffffff90;
  void *pvVar1;
  
  this_00 = *(DomColor **)(in_RDI + 0x40);
  if (this_00 != (DomColor *)0x0) {
    DomColor::~DomColor(this_00);
    operator_delete(this_00,0x18);
  }
  pvVar1 = *(void **)(in_RDI + 0x98);
  if (pvVar1 != (void *)0x0) {
    DomFont::~DomFont((DomFont *)in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x80);
  }
  pvVar1 = *(void **)(in_RDI + 0xa0);
  if (pvVar1 != (void *)0x0) {
    DomResourceIcon::~DomResourceIcon(in_stack_ffffffffffffff90);
    operator_delete(pvVar1,0x98);
  }
  pvVar1 = *(void **)(in_RDI + 0xa8);
  if (pvVar1 != (void *)0x0) {
    DomResourcePixmap::~DomResourcePixmap((DomResourcePixmap *)in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x58);
  }
  pvVar1 = *(void **)(in_RDI + 0xb0);
  if (pvVar1 != (void *)0x0) {
    DomPalette::~DomPalette(in_stack_ffffffffffffff60);
    operator_delete(pvVar1,0x20);
  }
  this_01 = *(DomPoint **)(in_RDI + 0xb8);
  if (this_01 != (DomPoint *)0x0) {
    DomPoint::~DomPoint(this_01);
    operator_delete(this_01,0xc);
  }
  this_02 = *(DomRect **)(in_RDI + 0xc0);
  if (this_02 != (DomRect *)0x0) {
    DomRect::~DomRect(this_02);
    operator_delete(this_02,0x14);
  }
  pvVar1 = *(void **)(in_RDI + 0xe0);
  if (pvVar1 != (void *)0x0) {
    DomLocale::~DomLocale((DomLocale *)in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x40);
  }
  pvVar1 = *(void **)(in_RDI + 0xe8);
  if (pvVar1 != (void *)0x0) {
    DomSizePolicy::~DomSizePolicy((DomSizePolicy *)in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x50);
  }
  this_03 = *(DomSize **)(in_RDI + 0xf0);
  if (this_03 != (DomSize *)0x0) {
    DomSize::~DomSize(this_03);
    operator_delete(this_03,0xc);
  }
  pvVar1 = *(void **)(in_RDI + 0xf8);
  if (pvVar1 != (void *)0x0) {
    DomString::~DomString((DomString *)in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x98);
  }
  pvVar1 = *(void **)(in_RDI + 0x100);
  if (pvVar1 != (void *)0x0) {
    DomStringList::~DomStringList(in_stack_ffffffffffffff50);
    operator_delete(pvVar1,0x98);
  }
  this_04 = *(DomDate **)(in_RDI + 0x118);
  if (this_04 != (DomDate *)0x0) {
    DomDate::~DomDate(this_04);
    operator_delete(this_04,0x10);
  }
  this_05 = *(DomTime **)(in_RDI + 0x120);
  if (this_05 != (DomTime *)0x0) {
    DomTime::~DomTime(this_05);
    operator_delete(this_05,0x10);
  }
  this_06 = *(DomDateTime **)(in_RDI + 0x128);
  if (this_06 != (DomDateTime *)0x0) {
    DomDateTime::~DomDateTime(this_06);
    operator_delete(this_06,0x1c);
  }
  this_07 = *(DomPointF **)(in_RDI + 0x130);
  if (this_07 != (DomPointF *)0x0) {
    DomPointF::~DomPointF(this_07);
    operator_delete(this_07,0x18);
  }
  this_08 = *(DomRectF **)(in_RDI + 0x138);
  if (this_08 != (DomRectF *)0x0) {
    DomRectF::~DomRectF(this_08);
    operator_delete(this_08,0x28);
  }
  this_11 = *(DomBrush **)(in_RDI + 0x140);
  if (this_11 != (DomBrush *)0x0) {
    DomSizeF::~DomSizeF((DomSizeF *)this_11);
    operator_delete(this_11,0x18);
  }
  this_09 = *(DomChar **)(in_RDI + 0x150);
  if (this_09 != (DomChar *)0x0) {
    DomChar::~DomChar(this_09);
    operator_delete(this_09,8);
  }
  this_10 = *(DomUrl **)(in_RDI + 0x158);
  if (this_10 != (DomUrl *)0x0) {
    DomUrl::~DomUrl(this_10);
    operator_delete(this_10,0x10);
  }
  pvVar1 = *(void **)(in_RDI + 0x170);
  if (pvVar1 != (void *)0x0) {
    DomBrush::~DomBrush(this_11);
    operator_delete(pvVar1,0x38);
  }
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined8 *)(in_RDI + 0x100) = 0;
  *(undefined4 *)(in_RDI + 0x108) = 0;
  *(undefined4 *)(in_RDI + 0x10c) = 0;
  *(undefined8 *)(in_RDI + 0x110) = 0;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = 0;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined4 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  return;
}

Assistant:

void DomProperty::clear()
{
    delete m_color;
    delete m_font;
    delete m_iconSet;
    delete m_pixmap;
    delete m_palette;
    delete m_point;
    delete m_rect;
    delete m_locale;
    delete m_sizePolicy;
    delete m_size;
    delete m_string;
    delete m_stringList;
    delete m_date;
    delete m_time;
    delete m_dateTime;
    delete m_pointF;
    delete m_rectF;
    delete m_sizeF;
    delete m_char;
    delete m_url;
    delete m_brush;

    m_kind = Unknown;

    m_color = nullptr;
    m_cursor = 0;
    m_font = nullptr;
    m_iconSet = nullptr;
    m_pixmap = nullptr;
    m_palette = nullptr;
    m_point = nullptr;
    m_rect = nullptr;
    m_locale = nullptr;
    m_sizePolicy = nullptr;
    m_size = nullptr;
    m_string = nullptr;
    m_stringList = nullptr;
    m_number = 0;
    m_float = 0.0;
    m_double = 0.0;
    m_date = nullptr;
    m_time = nullptr;
    m_dateTime = nullptr;
    m_pointF = nullptr;
    m_rectF = nullptr;
    m_sizeF = nullptr;
    m_longLong = 0;
    m_char = nullptr;
    m_url = nullptr;
    m_UInt = 0;
    m_uLongLong = 0;
    m_brush = nullptr;
}